

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchDiv.c
# Opt level: O1

int Fxch_DivCreate(Fxch_Man_t *pFxchMan,Fxch_SubCube_t *pSubCube0,Fxch_SubCube_t *pSubCube1)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int *piVar7;
  uint *puVar8;
  uint uVar9;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  Vec_Int_t *pVVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  uint uVar10;
  
  pVVar16 = pFxchMan->vCubeFree;
  pVVar16->nSize = 0;
  lVar22 = (long)(int)pSubCube0->iCube;
  if (lVar22 < 0) goto LAB_004b7dde;
  iVar1 = pFxchMan->vCubes->nSize;
  if (iVar1 <= (int)pSubCube0->iCube) goto LAB_004b7dde;
  uVar9 = *(uint *)&pSubCube0->field_0x8;
  pVVar5 = pFxchMan->vCubes->pArray;
  iVar2 = pVVar5[lVar22].nSize;
  if (iVar2 <= (int)(uVar9 & 0xffff)) goto LAB_004b7dfd;
  lVar21 = (long)(int)pSubCube1->iCube;
  if ((lVar21 < 0) || (iVar1 <= (int)pSubCube1->iCube)) goto LAB_004b7dde;
  uVar13 = *(uint *)&pSubCube1->field_0x8;
  iVar1 = pVVar5[lVar21].nSize;
  if (iVar1 <= (int)(uVar13 & 0xffff)) goto LAB_004b7dfd;
  piVar6 = pVVar5[lVar22].pArray;
  uVar12 = piVar6[uVar9 & 0xffff];
  piVar7 = pVVar5[lVar21].pArray;
  uVar14 = piVar7[uVar13 & 0xffff];
  if (uVar13 < 0x10000 && uVar9 < 0x10000) {
    Vec_IntPush(pVVar16,uVar12);
LAB_004b7956:
    pVVar16 = pFxchMan->vCubeFree;
    uVar12 = uVar14;
LAB_004b7960:
    Vec_IntPush(pVVar16,uVar12);
  }
  else {
    uVar19 = uVar9 >> 0x10;
    if (uVar13 < 0x10000 || uVar9 < 0x10000) {
      if (uVar9 < 0x10000) {
        if (iVar1 <= (int)(uVar13 >> 0x10)) goto LAB_004b7dfd;
        uVar9 = piVar7[uVar13 >> 0x10];
        Vec_IntPush(pVVar16,uVar12);
        if ((int)uVar12 < 0) {
LAB_004b7e5a:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x131,"int Abc_LitNot(int)");
        }
        if (uVar14 == (uVar12 ^ 1)) {
LAB_004b7b64:
          uVar12 = uVar9;
          pVVar16 = pFxchMan->vCubeFree;
          goto LAB_004b7960;
        }
        if (uVar9 == (uVar12 ^ 1)) goto LAB_004b7956;
      }
      else {
        if (iVar2 <= (int)uVar19) goto LAB_004b7dfd;
        uVar9 = piVar6[uVar19];
        Vec_IntPush(pVVar16,uVar14);
        if ((int)uVar14 < 0) goto LAB_004b7e5a;
        if (uVar12 == (uVar14 ^ 1)) goto LAB_004b7b64;
        if (uVar9 == (uVar14 ^ 1)) {
          pVVar16 = pFxchMan->vCubeFree;
          goto LAB_004b7960;
        }
      }
    }
    else {
      if ((iVar2 <= (int)uVar19) || (iVar1 <= (int)(uVar13 >> 0x10))) goto LAB_004b7dfd;
      iVar1 = piVar6[uVar19];
      iVar2 = piVar7[uVar13 >> 0x10];
      if ((int)uVar12 < (int)uVar14) {
        if ((((int)uVar12 < 0) || (Vec_IntPush(pVVar16,uVar12 * 2), (int)uVar14 < 0)) ||
           (Vec_IntPush(pFxchMan->vCubeFree,uVar14 * 2 + 1), iVar1 < 0)) goto LAB_004b7e1c;
        Vec_IntPush(pFxchMan->vCubeFree,iVar1 * 2);
      }
      else {
        if ((((int)uVar14 < 0) || (Vec_IntPush(pVVar16,uVar14 * 2), (int)uVar12 < 0)) ||
           (Vec_IntPush(pFxchMan->vCubeFree,uVar12 * 2 + 1), iVar2 < 0)) goto LAB_004b7e1c;
        Vec_IntPush(pFxchMan->vCubeFree,iVar2 * 2);
        iVar2 = iVar1;
      }
      if (iVar2 < 0) goto LAB_004b7e1c;
      Vec_IntPush(pFxchMan->vCubeFree,iVar2 * 2 + 1);
      if (pFxchMan->vCubeFree->nSize != 4) {
        __assert_fail("Vec_IntSize(vCubeFree) == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchDiv.c"
                      ,0x1e,"int Fxch_DivNormalize(Vec_Int_t *)");
      }
      puVar8 = (uint *)pFxchMan->vCubeFree->pArray;
      uVar9 = *puVar8;
      if (((int)uVar9 < 0) || (uVar13 = puVar8[1], (int)uVar13 < 0)) {
LAB_004b7e3b:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      uVar14 = uVar9 & 1;
      uVar19 = uVar13 & 1;
      uVar12 = puVar8[2];
      if ((uVar13 ^ uVar9) < 4 && uVar14 != uVar19) {
        if (((int)uVar12 < 0) || (uVar15 = puVar8[3], (int)uVar15 < 0)) goto LAB_004b7e3b;
        uVar17 = uVar12 & 1;
        uVar20 = uVar15 & 1;
        if (uVar17 == uVar20) {
          return -1;
        }
        uVar11 = uVar9;
        uVar10 = uVar13;
        if (uVar14 == uVar17) {
          uVar18 = uVar15;
          uVar15 = uVar12;
          if (uVar19 != uVar20) {
            __assert_fail("Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[3])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchDiv.c"
                          ,0x26,"int Fxch_DivNormalize(Vec_Int_t *)");
          }
        }
        else {
          if (uVar14 != uVar20) {
            __assert_fail("Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[3])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchDiv.c"
                          ,0x2b,"int Fxch_DivNormalize(Vec_Int_t *)");
          }
          uVar18 = uVar12;
          if (uVar19 != uVar17) {
            __assert_fail("Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[2])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchDiv.c"
                          ,0x2c,"int Fxch_DivNormalize(Vec_Int_t *)");
          }
        }
      }
      else {
        if ((int)uVar12 < 0) goto LAB_004b7e3b;
        uVar17 = uVar12 & 1;
        uVar15 = puVar8[3];
        uVar18 = uVar9;
        if ((uVar12 ^ uVar13) < 4 && uVar19 != uVar17) {
          if ((int)uVar15 < 0) goto LAB_004b7e3b;
          if (uVar14 == (uVar15 & 1)) {
            return -1;
          }
          uVar11 = uVar13;
          uVar10 = uVar12;
          if (uVar14 == uVar19) {
            uVar18 = uVar15;
            uVar15 = uVar9;
          }
        }
        else {
          if ((int)uVar15 < 0) goto LAB_004b7e3b;
          if (uVar14 == uVar19) {
            return -1;
          }
          if (uVar17 == (uVar15 & 1)) {
            return -1;
          }
          if (3 < (uVar15 ^ uVar12)) {
            return -1;
          }
          uVar11 = uVar12;
          uVar10 = uVar15;
          uVar15 = uVar13;
          if (uVar17 == uVar14) {
            uVar18 = uVar13;
            uVar15 = uVar9;
          }
        }
      }
      uVar9 = uVar10 >> 1;
      if ((uVar10 ^ uVar11) >> 1 != 1) {
        __assert_fail("LitA0 == Abc_LitNot(LitB0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchDiv.c"
                      ,0x46,"int Fxch_DivNormalize(Vec_Int_t *)");
      }
      uVar18 = uVar18 >> 1;
      uVar13 = uVar11 >> 1;
      uVar12 = uVar15 >> 1;
      if ((uVar11 & 2) == 0) {
        uVar13 = uVar9;
        uVar12 = uVar18;
        uVar9 = uVar11 >> 1;
        uVar18 = uVar15 >> 1;
      }
      if ((uVar9 & 1) != 0) {
        __assert_fail("!Abc_LitIsCompl(LitA0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchDiv.c"
                      ,0x4c,"int Fxch_DivNormalize(Vec_Int_t *)");
      }
      *puVar8 = uVar9 * 2;
      puVar8[1] = uVar13 * 2 + 1;
      puVar8[2] = uVar18 * 2 & 0xfffffffc;
      puVar8[3] = (uVar12 ^ uVar18 & 1) * 2 + 1;
    }
  }
  iVar1 = pFxchMan->vCubeFree->nSize;
  if ((long)iVar1 == 0) {
    return -1;
  }
  if (iVar1 == 2) {
    qsort(pFxchMan->vCubeFree->pArray,(long)iVar1,4,Vec_IntSortCompare1);
    pVVar16 = pFxchMan->vCubeFree;
    if (pVVar16->nSize < 1) {
LAB_004b7dfd:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    piVar6 = pVVar16->pArray;
    if (*piVar6 < 0) {
LAB_004b7e1c:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    *piVar6 = *piVar6 * 2;
    if (pVVar16->nSize < 2) goto LAB_004b7dfd;
    if (piVar6[1] < 0) goto LAB_004b7e1c;
    piVar6[1] = piVar6[1] * 2 + 1;
  }
  uVar3 = pSubCube0->iCube;
  if (-1 < (long)(int)uVar3) {
    iVar1 = pFxchMan->vCubes->nSize;
    if ((int)uVar3 < iVar1) {
      uVar4 = pSubCube1->iCube;
      if ((-1 < (long)(int)uVar4) && ((int)uVar4 < iVar1)) {
        uVar9 = pFxchMan->vCubeFree->nSize;
        if ((uVar9 & 1) != 0) {
          return -1;
        }
        pVVar16 = pFxchMan->vCubes->pArray;
        iVar1 = pVVar16[(int)uVar3].nSize;
        iVar2 = pVVar16[(int)uVar4].nSize;
        if (iVar1 < iVar2) {
          iVar2 = iVar1;
        }
        return ~((int)uVar9 >> 1) + iVar2;
      }
    }
  }
LAB_004b7dde:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

int Fxch_DivCreate( Fxch_Man_t* pFxchMan,
                    Fxch_SubCube_t* pSubCube0,
                    Fxch_SubCube_t* pSubCube1 )
{
    int Base = 0;

    int SC0_Lit0,
        SC0_Lit1,
        SC1_Lit0,
        SC1_Lit1;

    int Cube0Size,
        Cube1Size;

    Vec_IntClear( pFxchMan->vCubeFree );

    SC0_Lit0 = Fxch_ManGetLit( pFxchMan, pSubCube0->iCube, pSubCube0->iLit0 );
    SC0_Lit1 = 0;
    SC1_Lit0 = Fxch_ManGetLit( pFxchMan, pSubCube1->iCube, pSubCube1->iLit0 );
    SC1_Lit1 = 0;

    if ( pSubCube0->iLit1 == 0 && pSubCube1->iLit1 == 0 )
    {
        Vec_IntPush( pFxchMan->vCubeFree, SC0_Lit0 );
        Vec_IntPush( pFxchMan->vCubeFree, SC1_Lit0 );
    }
    else if ( pSubCube0->iLit1 > 0 && pSubCube1->iLit1 > 0 )
    {
        int RetValue;

        SC0_Lit1 = Fxch_ManGetLit( pFxchMan, pSubCube0->iCube, pSubCube0->iLit1 );
        SC1_Lit1 = Fxch_ManGetLit( pFxchMan, pSubCube1->iCube, pSubCube1->iLit1 );

        if ( SC0_Lit0 < SC1_Lit0 )
        {
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC0_Lit0, 0 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC1_Lit0, 1 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC0_Lit1, 0 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC1_Lit1, 1 ) );
        }
        else
        {
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC1_Lit0, 0 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC0_Lit0, 1 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC1_Lit1, 0 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC0_Lit1, 1 ) );
        }

        RetValue = Fxch_DivNormalize( pFxchMan->vCubeFree );
        if ( RetValue == -1 )
            return -1;
    } 
    else
    {
        if ( pSubCube0->iLit1 > 0 )
        {
            SC0_Lit1 = Fxch_ManGetLit( pFxchMan, pSubCube0->iCube, pSubCube0->iLit1 );

            Vec_IntPush( pFxchMan->vCubeFree, SC1_Lit0 );
            if ( SC0_Lit0 == Abc_LitNot( SC1_Lit0 ) )
                Vec_IntPush( pFxchMan->vCubeFree, SC0_Lit1 );
            else if ( SC0_Lit1 == Abc_LitNot( SC1_Lit0 ) )
                Vec_IntPush( pFxchMan->vCubeFree, SC0_Lit0 );
        }
        else 
        {
            SC1_Lit1 = Fxch_ManGetLit( pFxchMan, pSubCube1->iCube, pSubCube1->iLit1 );

            Vec_IntPush( pFxchMan->vCubeFree, SC0_Lit0 );
            if ( SC1_Lit0 == Abc_LitNot( SC0_Lit0 ) )
                Vec_IntPush( pFxchMan->vCubeFree, SC1_Lit1 );
            else if ( SC1_Lit1 == Abc_LitNot( SC0_Lit0 ) )
                Vec_IntPush( pFxchMan->vCubeFree, SC1_Lit0 );
        }
    }

    if ( Vec_IntSize( pFxchMan->vCubeFree ) == 0 )
        return -1;

    if ( Vec_IntSize ( pFxchMan->vCubeFree ) == 2 )
    {
        Vec_IntSort( pFxchMan->vCubeFree, 0 );

        Vec_IntWriteEntry( pFxchMan->vCubeFree, 0, Abc_Var2Lit( Vec_IntEntry( pFxchMan->vCubeFree, 0 ), 0 ) );
        Vec_IntWriteEntry( pFxchMan->vCubeFree, 1, Abc_Var2Lit( Vec_IntEntry( pFxchMan->vCubeFree, 1 ), 1 ) );
    }

    Cube0Size = Vec_IntSize( Fxch_ManGetCube( pFxchMan, pSubCube0->iCube ) );
    Cube1Size = Vec_IntSize( Fxch_ManGetCube( pFxchMan, pSubCube1->iCube ) );
    if ( Vec_IntSize( pFxchMan->vCubeFree ) % 2 == 0 )
    {
        Base = Abc_MinInt( Cube0Size, Cube1Size )
               -( Vec_IntSize( pFxchMan->vCubeFree ) / 2)  - 1; /* 1 or 2 Lits, 1 SOP NodeID */
    }
    else
        return -1;

    return Base;
}